

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_127a7::TestCheckArray2DCloseFailureIncludesDetails::RunImpl
          (TestCheckArray2DCloseFailureIncludesDetails *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  TestDetails local_8f8;
  int local_8d4;
  TestResults results;
  TestDetails details;
  float array2 [3] [3];
  float array1 [3] [3];
  RecordingReporter reporter;
  
  reporter.super_TestReporter._vptr_TestReporter = (_func_int **)&PTR__TestReporter_00150820;
  reporter.testRunCount = 0;
  reporter.testFailedCount = 0;
  reporter.lastFailedLine = 0;
  reporter.testFinishedCount = 0;
  reporter.lastStartedSuite[0] = '\0';
  reporter.lastStartedTest[0] = '\0';
  reporter.lastFailedFile[0] = '\0';
  reporter.lastFailedSuite[0] = '\0';
  reporter.lastFailedTest[0] = '\0';
  reporter.lastFailedMessage[0] = '\0';
  reporter.lastFinishedSuite[0] = '\0';
  reporter.lastFinishedTest[0] = '\0';
  reporter.lastFinishedTestTime = 0.0;
  reporter.summaryTotalTestCount = 0;
  reporter.summaryFailedTestCount = 0;
  reporter.summaryFailureCount = 0;
  reporter.summarySecondsElapsed = 0.0;
  UnitTest::TestResults::TestResults(&results,&reporter.super_TestReporter);
  UnitTest::TestDetails::TestDetails(&details,"array2DCloseTest","array2DCloseSuite","file",0x4d2);
  array1[1][1] = 2.5;
  array1[1][2] = 3.0;
  array1[2][0] = 3.0;
  array1[2][1] = 3.5;
  array1[0][0] = 1.0;
  array1[0][1] = 1.5;
  array1[0][2] = 2.0;
  array1[1][0] = 2.0;
  array1[2][2] = 4.0;
  array2[1][1] = 2.51;
  array2[1][2] = 3.01;
  array2[2][0] = 3.01;
  array2[2][1] = 3.51;
  array2[0][0] = 1.01;
  array2[0][1] = 1.51;
  array2[0][2] = 2.01;
  array2[1][0] = 2.01;
  array2[2][2] = 4.01;
  local_8f8.suiteName._0_4_ = 0x3a83126f;
  UnitTest::CheckArray2DClose<float[3][3],float[3][3],float>
            (&results,&array1,&array2,3,3,(float *)&local_8f8,&details);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_8f8,*ppTVar3,0x11f);
  UnitTest::CheckEqual(pTVar1,"array2DCloseTest",reporter.lastFailedTest,&local_8f8);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_8f8,*ppTVar3,0x120);
  UnitTest::CheckEqual(pTVar1,"array2DCloseSuite",reporter.lastFailedSuite,&local_8f8);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_8f8,*ppTVar3,0x121);
  UnitTest::CheckEqual(pTVar1,"file",reporter.lastFailedFile,&local_8f8);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_8d4 = 0x4d2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_8f8,*ppTVar3,0x122);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_8d4,&reporter.lastFailedLine,&local_8f8);
  UnitTest::TestReporter::~TestReporter(&reporter.super_TestReporter);
  return;
}

Assistant:

TEST(CheckEqualsWithStringsFailsOnDifferentStrings)
{
    char txt1[] = "Hello";
    char txt2[] = "Hallo";
    TestResults results;
    CheckEqual(results, txt1, txt2, TestDetails("", "", "", 0));
    CHECK_EQUAL(1, results.GetFailureCount());
}